

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_expression::translate
          (method_expression *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  bool bVar1;
  int iVar2;
  const_reference pptVar3;
  tree_type<cs::token_base_*> *tree_00;
  element_type *peVar4;
  token_base **pptVar5;
  statement_expression *in_RDX;
  bool bVar6;
  tree_type<cs::token_base_*> *tree;
  tree_type<cs::token_base_*> *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  element_type *in_stack_ffffffffffffffa0;
  iterator in_stack_ffffffffffffffc8;
  iterator in_stack_ffffffffffffffd0;
  statement_base *local_8;
  
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_ffffffffffffffa0);
  pptVar3 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::front
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_ffffffffffffffa0);
  tree_00 = token_expr::get_tree((token_expr *)*pptVar3);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x56091c);
  peVar4 = std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x560924);
  bVar6 = false;
  if ((peVar4->fold_expr & 1U) != 0) {
    in_stack_ffffffffffffffd0 = tree_type<cs::token_base_*>::root(in_stack_ffffffffffffff88);
    bVar1 = tree_type<cs::token_base_*>::iterator::usable((iterator *)&stack0xffffffffffffffd0);
    bVar6 = false;
    if (bVar1) {
      in_stack_ffffffffffffffc8 = tree_type<cs::token_base_*>::root(in_stack_ffffffffffffff88);
      pptVar5 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)in_stack_ffffffffffffffd0.mData);
      iVar2 = (*(*pptVar5)->_vptr_token_base[2])();
      bVar6 = iVar2 == 7;
    }
  }
  if (bVar6) {
    local_8 = (statement_base *)0x0;
  }
  else {
    local_8 = (statement_base *)statement_base::operator_new(in_stack_ffffffffffffff90);
    tree_type<cs::token_base_*>::tree_type
              ((tree_type<cs::token_base_*> *)local_8,in_stack_ffffffffffffff88);
    std::shared_ptr<cs::context_type>::shared_ptr
              ((shared_ptr<cs::context_type> *)local_8,
               (shared_ptr<cs::context_type> *)&stack0xffffffffffffffa0);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             *)in_stack_ffffffffffffffa0);
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
               in_stack_ffffffffffffffa0);
    statement_expression::statement_expression
              (in_RDX,tree_00,(context_t *)in_stack_ffffffffffffffd0.mData,
               (token_base *)in_stack_ffffffffffffffc8.mData);
    std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x560a1d);
    tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x560a27);
  }
  return local_8;
}

Assistant:

statement_base *
	method_expression::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().front())->get_tree();
		if (context->compiler->fold_expr && tree.root().usable() &&
		        tree.root().data()->get_type() == token_types::value)
			return nullptr;
		else
			return new statement_expression(tree, context, raw.front().back());
	}